

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<const_char_*>::erase(SmallVectorImpl<const_char_*> *this,const_iterator CI)

{
  const_iterator ppcVar1;
  ulong uVar2;
  size_t __n;
  
  ppcVar1 = (const_iterator)
            (this->super_SmallVectorTemplateBase<const_char_*,_true>).
            super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX;
  if (CI < ppcVar1) {
    __assert_fail("I >= this->begin() && \"Iterator to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1c1,
                  "iterator llvm::SmallVectorImpl<const char *>::erase(const_iterator) [T = const char *]"
                 );
  }
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<const_char_*,_true>).
                 super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
  ppcVar1 = ppcVar1 + uVar2;
  if (CI < ppcVar1) {
    __n = (long)ppcVar1 - (long)(CI + 1);
    if (__n != 0) {
      memmove(CI,CI + 1,__n);
      uVar2 = (ulong)(this->super_SmallVectorTemplateBase<const_char_*,_true>).
                     super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
    }
    if (uVar2 - 1 <=
        (ulong)(this->super_SmallVectorTemplateBase<const_char_*,_true>).
               super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Capacity) {
      (this->super_SmallVectorTemplateBase<const_char_*,_true>).
      super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size =
           (uint)(uVar2 - 1);
      return CI;
    }
    __assert_fail("Size <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  __assert_fail("I < this->end() && \"Erasing at past-the-end iterator.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x1c2,
                "iterator llvm::SmallVectorImpl<const char *>::erase(const_iterator) [T = const char *]"
               );
}

Assistant:

LLVM_ATTRIBUTE_ALWAYS_INLINE
  iterator begin() { return (iterator)this->BeginX; }